

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_time.c
# Opt level: O3

void ngx_libc_gmtime(time_t s,tm *tm)

{
  time_t local_10;
  time_t s_local;
  
  local_10 = s;
  gmtime_r(&local_10,(tm *)tm);
  return;
}

Assistant:

void
ngx_libc_gmtime(time_t s, struct tm *tm)
{
#if (NGX_HAVE_LOCALTIME_R)
    (void) gmtime_r(&s, tm);

#else
    struct tm  *t;

    t = gmtime(&s);
    *tm = *t;

#endif
}